

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O2

void __thiscall
kj::StringTree::visit<kj::StringTree::flattenTo(char*,char*)const::__0&>
          (StringTree *this,anon_class_16_2_77190bd5 *func)

{
  Branch *pBVar1;
  size_t sVar2;
  ulong uVar3;
  char *pcVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  StringTree *this_00;
  
  pBVar1 = (this->branches).ptr;
  uVar5 = 0;
  for (lVar7 = (this->branches).size_ << 6; this_00 = &pBVar1->content, lVar7 != 0;
      lVar7 = lVar7 + -0x40) {
    uVar3 = *(ulong *)((long)(this_00 + -1) + 0x30) - uVar5;
    if (uVar5 <= *(ulong *)((long)(this_00 + -1) + 0x30) && uVar3 != 0) {
      pcVar4 = "";
      if ((this->text).content.size_ != 0) {
        pcVar4 = (this->text).content.ptr;
      }
      uVar6 = (long)func->limit - (long)*func->target;
      if (uVar3 < uVar6) {
        uVar6 = uVar3;
      }
      memcpy(*func->target,pcVar4 + uVar5,uVar6);
      *func->target = *func->target + uVar6;
      uVar5 = *(ulong *)((long)(this_00 + -1) + 0x30);
    }
    visit<kj::StringTree::flattenTo(char*,char*)const::__0&>(this_00,func);
    pBVar1 = (Branch *)(this_00 + 1);
  }
  sVar2 = (this->text).content.size_;
  uVar3 = 0;
  if (sVar2 != 0) {
    uVar3 = sVar2 - 1;
  }
  uVar6 = uVar3 - uVar5;
  if (uVar5 <= uVar3 && uVar6 != 0) {
    if (sVar2 == 0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = (this->text).content.ptr;
    }
    uVar3 = (long)func->limit - (long)*func->target;
    if (uVar6 < uVar3) {
      uVar3 = uVar6;
    }
    memcpy(*func->target,pcVar4 + uVar5,uVar3);
    *func->target = *func->target + uVar3;
  }
  return;
}

Assistant:

void StringTree::visit(Func&& func) const {
  size_t pos = 0;
  for (auto& branch: branches) {
    if (branch.index > pos) {
      func(text.slice(pos, branch.index));
      pos = branch.index;
    }
    branch.content.visit(func);
  }
  if (text.size() > pos) {
    func(text.slice(pos, text.size()));
  }
}